

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

TriggerPrg * getRowTrigger(Parse *pParse,Trigger *pTrigger,Table *pTab,int orconf)

{
  undefined4 uVar1;
  undefined4 uVar2;
  byte bVar3;
  sqlite3 *db;
  sqlite3 *db_00;
  VdbeOp *pVVar4;
  u8 uVar5;
  int iVar6;
  TriggerPrg *pTVar7;
  SubProgram *pSVar8;
  Parse *pParse_00;
  Vdbe *pVVar9;
  char *pcVar10;
  Expr *pEVar11;
  SrcList *pSVar12;
  ExprList *pEVar13;
  Select *pSVar14;
  ExprList *pSet;
  Upsert *pUVar15;
  Parse *pWhere;
  int dest;
  Parse *pPVar16;
  Expr *in_R8;
  TriggerStep *pStep;
  Expr *in_stack_fffffffffffffef8;
  Vdbe *pVVar17;
  Expr *local_c0;
  undefined1 local_88 [20];
  undefined4 local_74;
  undefined1 local_68 [24];
  undefined1 local_50 [16];
  undefined1 local_40 [16];
  
  pPVar16 = pParse->pToplevel;
  if (pParse->pToplevel == (Parse *)0x0) {
    pPVar16 = pParse;
  }
  pTVar7 = pPVar16->pTriggerPrg;
  while( true ) {
    if (pTVar7 == (TriggerPrg *)0x0) {
      db = pParse->db;
      pTVar7 = (TriggerPrg *)sqlite3DbMallocZero(db,0x28);
      if (pTVar7 != (TriggerPrg *)0x0) {
        pTVar7->pNext = pPVar16->pTriggerPrg;
        pPVar16->pTriggerPrg = pTVar7;
        pSVar8 = (SubProgram *)sqlite3DbMallocZero(db,0x30);
        pTVar7->pProgram = pSVar8;
        if (pSVar8 != (SubProgram *)0x0) {
          pVVar9 = pPVar16->pVdbe;
          pSVar8->pNext = pVVar9->pProgram;
          pVVar9->pProgram = pSVar8;
          pTVar7->pTrigger = pTrigger;
          pTVar7->orconf = orconf;
          pTVar7->aColmask[0] = 0xffffffff;
          pTVar7->aColmask[1] = 0xffffffff;
          pParse_00 = (Parse *)sqlite3DbMallocZero(db,0x1a0);
          if (pParse_00 != (Parse *)0x0) {
            local_40 = (undefined1  [16])0x0;
            local_50 = (undefined1  [16])0x0;
            local_68._8_16_ = (undefined1  [16])0x0;
            pParse_00->db = db;
            pParse_00->pTriggerTab = pTab;
            pParse_00->pToplevel = pPVar16;
            pParse_00->zAuthContext = pTrigger->zName;
            pParse_00->eTriggerOp = pTrigger->op;
            pParse_00->nQueryLoop = pParse->nQueryLoop;
            pParse_00->disableVtab = pParse->disableVtab;
            pWhere = pParse;
            local_68._0_8_ = pParse_00;
            pVVar9 = sqlite3GetVdbe(pParse_00);
            if (pVVar9 != (Vdbe *)0x0) {
              if (pTrigger->zName != (char *)0x0) {
                pcVar10 = sqlite3MPrintf(db,"-- TRIGGER %s");
                pWhere = (Parse *)0xfffffff9;
                sqlite3VdbeChangeP4(pVVar9,-1,pcVar10,-7);
              }
              if (pTrigger->pWhen == (Expr *)0x0) {
                dest = 0;
              }
              else {
                dest = 0;
                pWhere = (Parse *)0x0;
                pEVar11 = exprDup(db,pTrigger->pWhen,0,(u8 **)0x0);
                iVar6 = sqlite3ResolveExprNames((NameContext *)local_68,pEVar11);
                if ((iVar6 == 0) && (db->mallocFailed == '\0')) {
                  dest = pParse_00->nLabel + -1;
                  pParse_00->nLabel = dest;
                  pWhere = (Parse *)0x10;
                  sqlite3ExprIfFalse(pParse_00,pEVar11,dest,0x10);
                }
                if (pEVar11 != (Expr *)0x0) {
                  sqlite3ExprDeleteNN(db,pEVar11);
                }
              }
              pStep = pTrigger->step_list;
              if (pStep != (TriggerStep *)0x0) {
                db_00 = pParse_00->db;
                pVVar17 = pParse_00->pVdbe;
                do {
                  uVar5 = (u8)orconf;
                  if (orconf == 0xb) {
                    uVar5 = pStep->orconf;
                  }
                  pParse_00->eOrconf = uVar5;
                  if (pStep->zSpan != (char *)0x0) {
                    pcVar10 = sqlite3MPrintf(db_00,"-- %s");
                    in_R8 = (Expr *)0x0;
                    iVar6 = sqlite3VdbeAddOp3(pVVar17,0xa8,0x7fffffff,1,0);
                    pWhere = (Parse *)0xfffffff9;
                    sqlite3VdbeChangeP4(pVVar17,iVar6,pcVar10,-7);
                  }
                  uVar5 = pStep->op;
                  if (uVar5 == 'x') {
                    pSVar12 = targetSrcList(pParse_00,pStep);
                    pSVar14 = sqlite3SelectDup(db_00,pStep->pSelect,0);
                    pWhere = (Parse *)sqlite3IdListDup(db_00,pStep->pIdList);
                    bVar3 = pParse_00->eOrconf;
                    pUVar15 = pStep->pUpsert;
                    if (pUVar15 == (Upsert *)0x0) {
                      pUVar15 = (Upsert *)0x0;
                    }
                    else {
                      pEVar13 = sqlite3ExprListDup(db_00,pUVar15->pUpsertTarget,0);
                      if (pUVar15->pUpsertTargetWhere == (Expr *)0x0) {
                        local_c0 = (Expr *)0x0;
                      }
                      else {
                        local_c0 = exprDup(db_00,pUVar15->pUpsertTargetWhere,0,(u8 **)0x0);
                      }
                      pSet = sqlite3ExprListDup(db_00,pUVar15->pUpsertSet,0);
                      if (pUVar15->pUpsertWhere == (Expr *)0x0) {
                        pEVar11 = (Expr *)0x0;
                      }
                      else {
                        pEVar11 = exprDup(db_00,pUVar15->pUpsertWhere,0,(u8 **)0x0);
                      }
                      pUVar15 = sqlite3UpsertNew(db_00,pEVar13,local_c0,pSet,pEVar11);
                    }
                    in_R8 = (Expr *)(ulong)bVar3;
                    sqlite3Insert(pParse_00,pSVar12,pSVar14,(IdList *)pWhere,(uint)bVar3,pUVar15);
                  }
                  else if (uVar5 == 'y') {
                    pSVar12 = targetSrcList(pParse_00,pStep);
                    if (pStep->pWhere == (Expr *)0x0) {
                      pEVar11 = (Expr *)0x0;
                    }
                    else {
                      pWhere = (Parse *)0x0;
                      pEVar11 = exprDup(db_00,pStep->pWhere,0,(u8 **)0x0);
                    }
                    sqlite3DeleteFrom(pParse_00,pSVar12,pEVar11,(ExprList *)pWhere,in_R8);
                  }
                  else if (uVar5 == 'z') {
                    pSVar12 = targetSrcList(pParse_00,pStep);
                    pEVar13 = sqlite3ExprListDup(db_00,pStep->pExprList,0);
                    if (pStep->pWhere == (Expr *)0x0) {
                      pWhere = (Parse *)0x0;
                    }
                    else {
                      pWhere = (Parse *)exprDup(db_00,pStep->pWhere,0,(u8 **)0x0);
                    }
                    in_R8 = (Expr *)(ulong)pParse_00->eOrconf;
                    sqlite3Update(pParse_00,pSVar12,pEVar13,(Expr *)pWhere,(uint)pParse_00->eOrconf,
                                  (ExprList *)0x0,in_stack_fffffffffffffef8,(Upsert *)pVVar9);
                  }
                  else {
                    pSVar14 = sqlite3SelectDup(db_00,pStep->pSelect,0);
                    local_88[0] = '\x04';
                    local_88._4_16_ = (undefined1  [16])0x0;
                    local_74 = 0;
                    sqlite3Select(pParse_00,pSVar14,(SelectDest *)local_88);
                    if (pSVar14 != (Select *)0x0) {
                      clearSelect(db_00,pSVar14,1);
                    }
                  }
                  if (pStep->op != 0x83) {
                    pWhere = (Parse *)0x0;
                    in_R8 = (Expr *)0x0;
                    sqlite3VdbeAddOp3(pVVar17,0x7c,0,0,0);
                  }
                  pStep = pStep->pNext;
                } while (pStep != (TriggerStep *)0x0);
              }
              pVVar17 = pVVar9;
              if (dest != 0) {
                sqlite3VdbeResolveLabel(pVVar9,dest);
              }
              sqlite3VdbeAddOp3(pVVar9,0x45,0,0,0);
              pcVar10 = pParse_00->zErrMsg;
              if (pParse->nErr == 0) {
                pParse->zErrMsg = pcVar10;
                pParse->nErr = pParse_00->nErr;
                pParse->rc = pParse_00->rc;
              }
              else if (pcVar10 != (char *)0x0) {
                sqlite3DbFreeNN(pParse_00->db,pcVar10);
              }
              if ((db->mallocFailed == '\0') && (pParse->nErr == 0)) {
                pVVar4 = pVVar17->aOp;
                pVVar9 = pVVar17;
                resolveP2Values(pVVar17,&pPVar16->nMaxArg);
                pSVar8->nOp = pVVar9->nOp;
                pVVar9->aOp = (Op *)0x0;
                pSVar8->aOp = pVVar4;
              }
              uVar1 = pParse_00->nTab;
              uVar2 = pParse_00->nMem;
              pSVar8->nMem = uVar2;
              pSVar8->nCsr = uVar1;
              pSVar8->token = pTrigger;
              pTVar7->aColmask[0] = pParse_00->oldmask;
              pTVar7->aColmask[1] = pParse_00->newmask;
              sqlite3VdbeDelete(pVVar9);
            }
            sqlite3ParserReset(pParse_00);
            sqlite3DbFreeNN(db,pParse_00);
            return pTVar7;
          }
        }
      }
      return (TriggerPrg *)0x0;
    }
    if ((pTVar7->pTrigger == pTrigger) && (pTVar7->orconf == orconf)) break;
    pTVar7 = pTVar7->pNext;
  }
  return pTVar7;
}

Assistant:

static TriggerPrg *getRowTrigger(
  Parse *pParse,       /* Current parse context */
  Trigger *pTrigger,   /* Trigger to code */
  Table *pTab,         /* The table trigger pTrigger is attached to */
  int orconf           /* ON CONFLICT algorithm. */
){
  Parse *pRoot = sqlite3ParseToplevel(pParse);
  TriggerPrg *pPrg;

  assert( pTrigger->zName==0 || pTab==tableOfTrigger(pTrigger) );

  /* It may be that this trigger has already been coded (or is in the
  ** process of being coded). If this is the case, then an entry with
  ** a matching TriggerPrg.pTrigger field will be present somewhere
  ** in the Parse.pTriggerPrg list. Search for such an entry.  */
  for(pPrg=pRoot->pTriggerPrg; 
      pPrg && (pPrg->pTrigger!=pTrigger || pPrg->orconf!=orconf); 
      pPrg=pPrg->pNext
  );

  /* If an existing TriggerPrg could not be located, create a new one. */
  if( !pPrg ){
    pPrg = codeRowTrigger(pParse, pTrigger, pTab, orconf);
  }

  return pPrg;
}